

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::MultiReporter::assertionEnded(MultiReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  reference this_00;
  IEventListener *pIVar3;
  ReporterPreferences *pRVar4;
  AssertionResult *in_RSI;
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  *in_RDI;
  unique_ptr<Catch::IEventListener> *reporterish;
  iterator __end1;
  iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  *__range1;
  bool reportByDefault;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar5;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
  local_28;
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  *local_20;
  byte local_11;
  AssertionResult *local_10;
  
  local_10 = in_RSI;
  OVar2 = AssertionResult::getResultType(in_RSI);
  bVar5 = 1;
  if (OVar2 == Ok) {
    bVar5 = (**(code **)&((in_RDI->
                          super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage)->m_ptr[1].
                         m_preferences)();
  }
  local_11 = bVar5 & 1;
  local_20 = in_RDI + 1;
  local_28._M_current =
       (unique_ptr<Catch::IEventListener> *)
       std::
       vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
       ::begin(in_RDI);
  std::
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  ::end(in_RDI);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
                        *)CONCAT17(bVar5,in_stack_ffffffffffffffc0),
                       (__normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
                        *)in_RDI);
    if (!bVar1) {
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
              ::operator*(&local_28);
    if ((local_11 & 1) == 0) {
      pIVar3 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
      pRVar4 = Catch::IEventListener::getPreferences(pIVar3);
      if ((pRVar4->shouldReportAllAssertions & 1U) != 0) goto LAB_001a9829;
    }
    else {
LAB_001a9829:
      pIVar3 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
      (*pIVar3->_vptr_IEventListener[0xd])(pIVar3,local_10);
    }
    __gnu_cxx::
    __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

void MultiReporter::assertionEnded( AssertionStats const& assertionStats ) {
        const bool reportByDefault =
            assertionStats.assertionResult.getResultType() != ResultWas::Ok ||
            m_config->includeSuccessfulResults();

        for ( auto & reporterish : m_reporterLikes ) {
            if ( reportByDefault ||
                 reporterish->getPreferences().shouldReportAllAssertions ) {
                    reporterish->assertionEnded( assertionStats );
            }
        }
    }